

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O1

gfield * __thiscall gfield::sub<13,13>(gfield *this,bigint<13> *x,bigint<13> *y)

{
  ushort uVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  byte bVar6;
  bigint<13> *pbVar7;
  gfint tmp;
  bigint<13> bStack_38;
  
  uVar2 = x->len;
  uVar5 = (ulong)uVar2;
  if (y->len <= (int)uVar2) {
    pbVar7 = y;
    if (y->len < (int)uVar2) goto LAB_0015cfe2;
    do {
      bVar6 = (byte)pbVar7;
      iVar4 = (int)uVar5;
      if (iVar4 < 1) goto LAB_0015cfd1;
      uVar1 = x->digits[uVar5 - 1];
      pbVar7 = (bigint<13> *)(ulong)uVar1;
      lVar3 = uVar5 - 1;
      if (uVar1 < y->digits[lVar3]) {
        bVar6 = 1;
        goto LAB_0015cfd1;
      }
      uVar5 = uVar5 - 1;
    } while (uVar1 <= y->digits[lVar3]);
    bVar6 = 0;
LAB_0015cfd1:
    if ((~bVar6 & 1) != 0 || iVar4 < 1) goto LAB_0015cfe2;
  }
  bigint<13>::add<13,13>(&bStack_38,x,&P.super_gfint);
  x = &bStack_38;
LAB_0015cfe2:
  bigint<13>::sub<13,13>(&this->super_gfint,x,y);
  return this;
}

Assistant:

gfield &sub(const bigint<X_DIGITS> &x, const bigint<Y_DIGITS> &y)
    {
        if(x < y)
        {
            gfint tmp; /* necessary if this==&y, using this instead would clobber y */
            tmp.add(x, P);
            gfint::sub(tmp, y);
        }
        else gfint::sub(x, y);
        return *this;
    }